

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

int lyd_insert_common(lyd_node *parent,lyd_node **sibling,lyd_node *node,int invalidate)

{
  lyd_node **pplVar1;
  uint uVar2;
  lyd_node *plVar3;
  lyd_node *plVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  lys_node *plVar11;
  lys_node *plVar12;
  LY_ERR *pLVar13;
  ly_set *set;
  lys_module *module;
  lys_node *plVar14;
  lyd_node *plVar15;
  lyd_node **pplVar16;
  lyd_node *plVar17;
  lyd_node *plVar18;
  int permanent;
  lyd_node *plVar19;
  int iVar20;
  LYS_NODE LVar21;
  bool bVar22;
  lyd_node *local_40;
  char local_31;
  
  if (parent == (lyd_node *)0x0 && sibling == (lyd_node **)0x0) {
    __assert_fail("parent || sibling",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0xd9a,
                  "int lyd_insert_common(struct lyd_node *, struct lyd_node **, struct lyd_node *, int)"
                 );
  }
  if (parent == (lyd_node *)0x0) {
    plVar3 = *sibling;
    do {
      local_40 = plVar3;
      plVar3 = local_40->prev;
    } while (local_40->prev->next != (lyd_node *)0x0);
  }
  else {
    local_40 = parent->child;
    plVar11 = parent->schema;
    if (local_40 == (lyd_node *)0x0) {
      LVar21 = LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER;
      if ((plVar11->nodetype & (LYS_ACTION|LYS_RPC)) == LYS_UNKNOWN) {
        LVar21 = LYS_OUTPUT|LYS_INPUT|LYS_NOTIF|LYS_LIST|LYS_CONTAINER;
      }
      goto LAB_0015f416;
    }
    LVar21 = LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER;
    if ((plVar11->nodetype & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN) goto LAB_0015f416;
  }
  plVar11 = lys_parent(local_40->schema);
  for (; LVar21 = LYS_OUTPUT|LYS_INPUT|LYS_NOTIF|LYS_LIST|LYS_CONTAINER, plVar11 != (lys_node *)0x0;
      plVar11 = lys_parent(plVar11)) {
    if ((plVar11->nodetype & (LYS_OUTPUT|LYS_INPUT|LYS_NOTIF|LYS_LIST|LYS_CONTAINER)) != LYS_UNKNOWN
       ) goto LAB_0015f416;
  }
  plVar11 = (lys_node *)0x0;
LAB_0015f416:
  plVar12 = node->schema;
  do {
    plVar12 = lys_parent(plVar12);
    if (plVar12 == (lys_node *)0x0) {
      plVar12 = (lys_node *)0x0;
      break;
    }
  } while ((plVar12->nodetype & LVar21) == LYS_UNKNOWN);
  if (plVar11 != plVar12) {
    pLVar13 = ly_errno_location();
    *pLVar13 = LY_EINVAL;
    return 1;
  }
  local_31 = '\x01';
  permanent = 0;
  if ((invalidate != 0) &&
     ((iVar9 = lyp_is_rpc_action(node->schema), parent == (lyd_node *)0x0 ||
      (iVar9 != 0 || node->parent != parent)))) {
    permanent = iVar9 + 1;
    local_31 = iVar9 == 0;
  }
  if ((node->parent != (lyd_node *)0x0) || (node->prev->next != (lyd_node *)0x0)) {
    lyd_unlink_internal(node,permanent);
  }
  set = (ly_set *)calloc(1,0x10);
  pplVar1 = &parent->child;
  bVar7 = false;
LAB_0015f4ce:
  plVar3 = node->next;
  if ((permanent == 1) &&
     (iVar9 = lyv_multicases(node,(lys_node *)0x0,&local_40,1,(lyd_node *)0x0), iVar9 != 0)) {
    ly_set_free(set);
    return 1;
  }
  bVar8 = node->field_0x9 & 1;
  if (bVar8 == 0) {
    bVar7 = true;
  }
  node->prev = node;
  node->next = (lyd_node *)0x0;
  if ((((parent == (lyd_node *)0x0) || (bVar8 != 0)) ||
      (((lys_node_list *)parent->schema)->nodetype != LYS_LIST)) ||
     ((((lys_node_leaf *)node->schema)->nodetype != LYS_LEAF ||
      (iVar9 = lys_is_key((lys_node_list *)parent->schema,(lys_node_leaf *)node->schema), iVar9 == 0
      )))) {
    plVar11 = node->schema;
    LVar21 = plVar11->nodetype;
    plVar17 = local_40;
    if (LVar21 != LYS_CONTAINER) {
      if (LVar21 != LYS_LEAF) {
        if ((LVar21 == LYS_LEAFLIST) &&
           ((uVar2 = set->number, uVar10 = ly_set_add(set,plVar11,0), uVar10 != uVar2 ||
            ((node->field_0x9 & 1) != 0)))) {
          plVar17 = local_40;
          if (local_40 == (lyd_node *)0x0) goto LAB_0015f6fe;
          do {
            plVar15 = plVar17->next;
            if (plVar17->schema == node->schema) {
              if ((node->field_0x9 & 1) == 0) {
                if ((plVar17->field_0x9 & 1) != 0) {
LAB_0015f676:
                  if (plVar17 == local_40) {
                    local_40 = plVar15;
                  }
                  lyd_free(plVar17);
                }
              }
              else if (((plVar17->field_0x9 & 1) == 0) ||
                      (((plVar17->schema->flags & 1) != 0 &&
                       (iVar9 = strcmp((char *)plVar17->child,(char *)node->child), iVar9 == 0))))
              goto LAB_0015f676;
            }
            plVar17 = plVar15;
          } while (plVar15 != (lyd_node *)0x0);
        }
        goto LAB_0015f6dd;
      }
      if (local_40 != (lyd_node *)0x0) goto LAB_0015f6b3;
LAB_0015f6fe:
      local_40 = node;
      if (parent != (lyd_node *)0x0) {
        *pplVar1 = node;
      }
      goto LAB_0015f8cd;
    }
    lVar5._0_2_ = plVar11[1].flags;
    lVar5._2_1_ = plVar11[1].ext_size;
    lVar5._3_1_ = plVar11[1].iffeature_size;
    lVar5._4_1_ = plVar11[1].padding[0];
    lVar5._5_1_ = plVar11[1].padding[1];
    lVar5._6_1_ = plVar11[1].padding[2];
    lVar5._7_1_ = plVar11[1].padding[3];
    if (local_40 != (lyd_node *)0x0 && lVar5 == 0) {
LAB_0015f6b3:
      if (plVar17->schema != plVar11) goto code_r0x0015f6b8;
      if (((node->field_0x9 & 1) != 0) || ((plVar17->field_0x9 & 1) != 0)) {
        plVar15 = node;
        if ((node->parent == (lyd_node *)0x0) && (node->prev->next == (lyd_node *)0x0)) {
          if (node->next != (lyd_node *)0x0) {
            plVar4 = plVar17->parent;
            plVar18 = node->next;
            plVar19 = node;
            do {
              plVar15 = plVar18;
              plVar19->parent = plVar4;
              plVar18 = plVar15->next;
              plVar19 = plVar15;
            } while (plVar15->next != (lyd_node *)0x0);
          }
        }
        else {
          node->next = (lyd_node *)0x0;
          node->prev = node;
        }
        plVar4 = plVar17->parent;
        if (plVar4 != (lyd_node *)0x0) {
          if (plVar4->child == plVar17) {
            plVar4->child = node;
          }
          plVar17->parent = (lyd_node *)0x0;
        }
        plVar4 = plVar17->prev;
        if (plVar4 != plVar17) {
          if (plVar4->next != (lyd_node *)0x0) {
            plVar4->next = node;
          }
          node->prev = plVar4;
          plVar17->prev = plVar17;
          plVar4 = plVar17->next;
          if (plVar4 == (lyd_node *)0x0) {
            plVar4 = node;
            if (node->parent == (lyd_node *)0x0) {
              do {
                plVar18 = plVar4;
                plVar4 = plVar18->prev;
              } while (plVar4 != plVar17);
              plVar18->prev = plVar15;
            }
            else {
              node->parent->child->prev = plVar15;
            }
          }
          else {
            plVar4->prev = plVar15;
            plVar15->next = plVar4;
            plVar17->next = (lyd_node *)0x0;
          }
        }
        lyd_free(plVar17);
        goto LAB_0015f8cd;
      }
    }
LAB_0015f6dd:
    if (local_40 == (lyd_node *)0x0) goto LAB_0015f6fe;
    if (local_31 != '\0') {
      plVar17 = local_40->prev;
      plVar17->next = node;
      node->prev = plVar17;
      local_40->prev = node;
      goto LAB_0015f8cd;
    }
    plVar11 = node->schema->parent;
    if ((plVar11->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN) {
      do {
        plVar11 = lys_parent(plVar11);
      } while ((plVar11->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN);
      if (local_40 != (lyd_node *)0x0) goto LAB_0015f747;
    }
    else {
LAB_0015f747:
      plVar12 = (lys_node *)0x0;
      plVar17 = local_40;
LAB_0015f74a:
      do {
        module = lys_node_module(plVar11);
        plVar12 = lys_getnext(plVar12,plVar11,module,0);
        if (plVar12 == (lys_node *)0x0) {
          plVar14 = node->schema;
        }
        else {
          plVar14 = node->schema;
          if ((plVar17->schema != plVar12) && (plVar14 != plVar12)) goto LAB_0015f74a;
        }
        if (plVar14 == plVar12) {
          if (((plVar12->nodetype & (LYS_LIST|LYS_LEAFLIST)) == LYS_UNKNOWN) ||
             (plVar17->schema != plVar14)) goto LAB_0015f863;
          goto LAB_0015f84c;
        }
        plVar17 = plVar17->next;
      } while (plVar17 != (lyd_node *)0x0);
    }
    goto LAB_0015f790;
  }
  plVar17 = *pplVar1;
  bVar22 = plVar17 != (lyd_node *)0x0;
  plVar15 = plVar17;
  if ((bVar22) && (1 < iVar9)) {
    iVar20 = 1;
    do {
      if (plVar15->schema->nodetype != LYS_LEAF) goto LAB_0015f5a1;
      plVar15 = plVar15->next;
      bVar22 = plVar15 != (lyd_node *)0x0;
    } while ((bVar22) && (bVar6 = iVar20 < iVar9 + -1, iVar20 = iVar20 + 1, bVar6));
  }
  if (!bVar22) goto LAB_0015f6dd;
LAB_0015f5a1:
  if (plVar17 == plVar15) {
    *pplVar1 = node;
    plVar17 = node;
  }
  plVar4 = plVar15->prev;
  if (plVar4->next != (lyd_node *)0x0) {
    plVar4->next = node;
  }
  node->prev = plVar4;
  plVar15->prev = node;
  node->next = plVar15;
  if (plVar17 != local_40) {
    local_40 = plVar17;
  }
  goto LAB_0015f8cd;
code_r0x0015f6b8:
  pplVar16 = &plVar17->next;
  plVar17 = *pplVar16;
  if (*pplVar16 == (lyd_node *)0x0) goto LAB_0015f6dd;
  goto LAB_0015f6b3;
  while (plVar17 = plVar17->next, plVar17 != (lyd_node *)0x0) {
LAB_0015f84c:
    if (plVar17->schema != plVar14) goto LAB_0015f863;
  }
LAB_0015f790:
  plVar17 = local_40->prev;
  plVar17->next = node;
  node->prev = plVar17;
  local_40->prev = node;
  goto LAB_0015f8cd;
LAB_0015f863:
  if (plVar17 == local_40) {
    pplVar16 = pplVar1;
    local_40 = node;
    if (parent != (lyd_node *)0x0) goto LAB_0015f884;
  }
  else {
    pplVar16 = &plVar17->prev->next;
LAB_0015f884:
    *pplVar16 = node;
  }
  node->prev = plVar17->prev;
  plVar17->prev = node;
  node->next = plVar17;
LAB_0015f8cd:
  node->parent = parent;
  if (invalidate != 0) {
    check_leaf_list_backlinks(node,0);
  }
  if (permanent != 0) {
    lyd_insert_setinvalid(node);
  }
  node = plVar3;
  if (plVar3 == (lyd_node *)0x0) goto LAB_0015f933;
  goto LAB_0015f4ce;
LAB_0015f933:
  ly_set_free(set);
  if (parent != (lyd_node *)0x0 && bVar7) {
    do {
      if ((parent->field_0x9 & 1) == 0) break;
      parent->field_0x9 = parent->field_0x9 & 0xfe;
      parent = parent->parent;
    } while (parent != (lyd_node *)0x0);
  }
  if (sibling != (lyd_node **)0x0) {
    *sibling = local_40;
    return 0;
  }
  return 0;
}

Assistant:

int
lyd_insert_common(struct lyd_node *parent, struct lyd_node **sibling, struct lyd_node *node, int invalidate)
{
    struct lys_node *par1, *par2;
    const struct lys_node *siter;
    struct lyd_node *start, *iter, *ins, *next1, *next2;
    int invalid = 0, isrpc = 0, clrdflt = 0;
    struct ly_set *llists = NULL;
    int pos, i;
    int stype = LYS_INPUT | LYS_OUTPUT;

    assert(parent || sibling);

    /* get first sibling */
    if (parent) {
        start = parent->child;
    } else {
        for (start = *sibling; start->prev->next; start = start->prev);
    }

    /* check placing the node to the appropriate place according to the schema */
    if (!start) {
        if (!parent) {
            /* empty tree to insert */
            if (node->parent || node->prev->next) {
                /* unlink the node first */
                lyd_unlink_internal(node, 1);
            } /* else insert also node's siblings */
            *sibling = node;
            return EXIT_SUCCESS;
        }
        par1 = parent->schema;
        if (par1->nodetype & (LYS_RPC | LYS_ACTION)) {
            /* it is not clear if the tree being created is going to
             * be rpc (LYS_INPUT) or rpc-reply (LYS_OUTPUT) so we have to
             * compare against LYS_RPC or LYS_ACTION in par2
             */
            stype = LYS_RPC | LYS_ACTION;
        }
    } else if (parent && (parent->schema->nodetype & (LYS_RPC | LYS_ACTION))) {
        par1 = parent->schema;
        stype = LYS_RPC | LYS_ACTION;
    } else {
        for (par1 = lys_parent(start->schema);
             par1 && !(par1->nodetype & (LYS_CONTAINER | LYS_LIST | LYS_INPUT | LYS_OUTPUT | LYS_NOTIF));
             par1 = lys_parent(par1));
    }
    for (par2 = lys_parent(node->schema);
         par2 && !(par2->nodetype & (LYS_CONTAINER | LYS_LIST | stype | LYS_NOTIF));
         par2 = lys_parent(par2));
    if (par1 != par2) {
        ly_errno = LY_EINVAL;
        return EXIT_FAILURE;
    }

    if (invalidate) {
        invalid = isrpc = lyp_is_rpc_action(node->schema);
        if (!parent || node->parent != parent || isrpc) {
            /* it is not just moving under a parent node or it is in an RPC where
             * nodes order matters, so the validation will be necessary */
            invalid++;
        }
    }

    /* unlink only if it is not a list of siblings without a parent and node is not the first sibling */
    if (node->parent || node->prev->next) {
        /* do it permanent if the parents are not exact same or if it is top-level */
        lyd_unlink_internal(node, invalid);
    }

    llists = ly_set_new();

    /* process the nodes to insert one by one */
    LY_TREE_FOR_SAFE(node, next1, ins) {
        if (invalid == 1) {
            /* auto delete nodes from other cases, if any;
             * this is done only if node->parent != parent */
            if (lyv_multicases(ins, NULL, &start, 1, NULL)) {
                goto error;
            }
        }

        /* isolate the node to be handled separately */
        ins->prev = ins;
        ins->next = NULL;

        iter = NULL;
        if (!ins->dflt) {
            clrdflt = 1;
        }

        /* are we inserting list key? */
        if (!ins->dflt && parent && parent->schema->nodetype == LYS_LIST && ins->schema->nodetype == LYS_LEAF
                && (pos = lys_is_key((struct lys_node_list *)parent->schema, (struct lys_node_leaf *)ins->schema))) {
            /* yes, we have a key, get know its position */
            for (i = 0, iter = parent->child;
                    iter && i < (pos - 1) && iter->schema->nodetype == LYS_LEAF;
                    i++, iter = iter->next) ;
            if (iter) {
                /* insert list's key to the correct position - before the iter */
                if (parent->child == iter) {
                    parent->child = ins;
                }
                if (iter->prev->next) {
                    iter->prev->next = ins;
                }
                ins->prev = iter->prev;
                iter->prev = ins;
                ins->next = iter;

                /* update start element */
                if (parent->child != start) {
                    start = parent->child;
                }
            }

            /* try to find previously present default instance to replace */
        } else if (ins->schema->nodetype == LYS_LEAFLIST) {
            i = (int)llists->number;
            if ((ly_set_add(llists, ins->schema, 0) != i) || ins->dflt) {
                /* each leaf-list must be cleared only once (except when looking for exact same existing dflt nodes) */
                LY_TREE_FOR_SAFE(start, next2, iter) {
                    if (iter->schema == ins->schema) {
                        if ((ins->dflt && (!iter->dflt || ((iter->schema->flags & LYS_CONFIG_W) &&
                                                           !strcmp(((struct lyd_node_leaf_list *)iter)->value_str,
                                                                  ((struct lyd_node_leaf_list *)ins)->value_str))))
                                || (!ins->dflt && iter->dflt)) {
                            if (iter == start) {
                                start = next2;
                            }
                            lyd_free(iter);
                        }
                    }
                }
            }
        } else if (ins->schema->nodetype == LYS_LEAF || (ins->schema->nodetype == LYS_CONTAINER
                        && !((struct lys_node_container *)ins->schema)->presence)) {
            LY_TREE_FOR(start, iter) {
                if (iter->schema == ins->schema) {
                    if (ins->dflt || iter->dflt) {
                        /* replace existing (either explicit or default) node with the new (either explicit or default) node */
                        lyd_replace(iter, ins, 1);
                    } else {
                        /* keep both explicit nodes, let the caller solve it later */
                        iter = NULL;
                    }
                    break;
                }
            }
        }

        if (!iter) {
            if (!start) {
                /* add as the only child of the parent */
                start = ins;
                if (parent) {
                    parent->child = ins;
                }
            } else if (isrpc) {
                /* add to the specific position in rpc/rpc-reply/action */
                for (par1 = ins->schema->parent; !(par1->nodetype & (LYS_INPUT | LYS_OUTPUT)); par1 = lys_parent(par1));
                siter = NULL;
                LY_TREE_FOR(start, iter) {
                    while ((siter = lys_getnext(siter, par1, lys_node_module(par1), 0))) {
                        if (iter->schema == siter || ins->schema == siter) {
                            break;
                        }
                    }
                    if (ins->schema == siter) {
                        if ((siter->nodetype & (LYS_LEAFLIST | LYS_LIST)) && iter->schema == siter) {
                            /* we are inserting leaflist/list instance, but since there are already
                             * some instances of the same leaflist/list, we want to insert the new one
                             * as the last instance, so here we have to move on */
                            while (iter && iter->schema == siter) {
                                iter = iter->next;
                            }
                            if (!iter) {
                                break;
                            }
                        }
                        /* we have the correct place for new node (before the iter) */
                        if (iter == start) {
                            start = ins;
                            if (parent) {
                                parent->child = ins;
                            }
                        } else {
                            iter->prev->next = ins;
                        }
                        ins->prev = iter->prev;
                        iter->prev = ins;
                        ins->next = iter;

                        /* we are done */
                        break;
                    }
                }
                if (!iter) {
                    /* add as the last child of the parent */
                    start->prev->next = ins;
                    ins->prev = start->prev;
                    start->prev = ins;
                }
            } else {
                /* add as the last child of the parent */
                start->prev->next = ins;
                ins->prev = start->prev;
                start->prev = ins;
            }
        }
        ins->parent = parent;

        if (invalidate) {
            check_leaf_list_backlinks(ins, 0);
        }

        if (invalid) {
            lyd_insert_setinvalid(ins);
        }
    }
    ly_set_free(llists);

    if (clrdflt) {
        /* remove the dflt flag from parents */
        for (iter = parent; iter && iter->dflt; iter = iter->parent) {
            iter->dflt = 0;
        }
    }

    if (sibling) {
        *sibling = start;
    }
    return EXIT_SUCCESS;

error:
    ly_set_free(llists);
    return EXIT_FAILURE;
}